

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultNamerDisposer.cpp
# Opt level: O2

void __thiscall
ApprovalTests::DefaultNamerDisposer::~DefaultNamerDisposer(DefaultNamerDisposer *this)

{
  function<std::shared_ptr<ApprovalTests::ApprovalNamer>_()> fStack_28;
  
  ::std::function<std::shared_ptr<ApprovalTests::ApprovalNamer>_()>::function
            (&fStack_28,&this->previous_result);
  DefaultNamerFactory::setDefaultNamer(&fStack_28);
  ::std::_Function_base::~_Function_base(&fStack_28.super__Function_base);
  ::std::_Function_base::~_Function_base((_Function_base *)this);
  return;
}

Assistant:

DefaultNamerDisposer::~DefaultNamerDisposer()
    {
        DefaultNamerFactory::setDefaultNamer(previous_result);
    }